

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.h
# Opt level: O1

void __thiscall
state_machine::variant::
Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
::~Variant(Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
           *this)

{
  switch(this->index_) {
  case '\0':
    break;
  case '\x01':
    get<(anonymous_namespace)::Empty,_0>(this);
    break;
  case '\x02':
    get<(anonymous_namespace)::Stopped,_0>(this);
    break;
  case '\x03':
    get<(anonymous_namespace)::Open,_0>(this);
    break;
  case '\x04':
    get<(anonymous_namespace)::Playing,_0>(this);
    break;
  default:
    get<(anonymous_namespace)::Paused,_0>(this);
  }
  return;
}

Assistant:

~Variant() noexcept(noexcept(std::declval<Variant>().destroy_internal())) {
        destroy_internal();
    }